

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::TPZCompElWithMem
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZInterfaceElement> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  TPZRegisterClassId *in_RDI;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_00000298
  ;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000002a0
  ;
  TPZInterfaceElement *in_stack_000002a8;
  TPZCompMesh *in_stack_000002b0;
  void **in_stack_000002b8;
  TPZInterfaceElement *in_stack_000002c0;
  TPZCompElWithMem<TPZInterfaceElement> *in_stack_ffffffffffffffb8;
  TPZCompElWithMem<TPZInterfaceElement> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElWithMem<TPZInterfaceElement>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024e9038);
  TPZInterfaceElement::TPZInterfaceElement
            (in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
             in_stack_000002a0,in_stack_00000298);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e8db0;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e8db0;
  TPZStack<long,_128>::TPZStack((TPZStack<long,_128> *)in_RDI);
  CopyIntPtIndicesFrom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}